

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void gl4cts::TextureViewUtilities::initTextureStorage
               (Functions *gl,bool init_mutable_to,GLenum texture_target,GLint texture_depth,
               GLint texture_height,GLint texture_width,GLenum texture_internalformat,
               GLenum texture_format,GLenum texture_type,uint n_levels_needed,uint n_cubemaps_needed
               ,GLint bo_id)

{
  GLenum GVar1;
  TestError *this;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  GLint gl_max_color_texture_samples_value;
  GLsizei local_44;
  char *local_40;
  char *local_38;
  
  gl_max_color_texture_samples_value = 0;
  (*gl->getIntegerv)(0x910e,&gl_max_color_texture_samples_value);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x848);
  if (texture_target == 0x8c2a) {
    (*gl->texBuffer)(0x8c2a,texture_internalformat,bo_id);
    GVar1 = (*gl->getError)();
    pcVar4 = "glTexBuffer() call failed for GL_TEXTURE_BUFFER target";
    iVar3 = 0x84e;
    goto LAB_00aaaa7a;
  }
  if (init_mutable_to) {
    local_44 = n_cubemaps_needed * 6;
    local_40 = "glTexImage3D() call failed for GL_TEXTURE_3D texture target";
    if (texture_target == 0x8c1a) {
      local_40 = "glTexImage3D() call failed for GL_TEXTURE_2D_ARRAY texture target";
    }
    pcVar4 = "glTexImage2D() call failed for GL_TEXTURE_RECTANGLE texture target";
    if (texture_target == 0xde1) {
      pcVar4 = "glTexImage2D() call failed for GL_TEXTURE_2D texture target";
    }
    local_38 = "glTexImage2D() call failed for GL_TEXTURE_1D_ARRAY texture target";
    if (texture_target != 0x8c18) {
      local_38 = pcVar4;
    }
    uVar5 = 0;
    do {
      if (n_levels_needed == uVar5) {
        return;
      }
      bVar2 = (byte)uVar5;
      if (uVar5 == 0) {
        if (texture_target == 0x9102) {
          (*gl->texImage3DMultisample)
                    (0x9102,gl_max_color_texture_samples_value,texture_internalformat,texture_width,
                     texture_height,texture_depth,'\x01');
          GVar1 = (*gl->getError)();
          pcVar4 = 
          "glTexImage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY texture target"
          ;
          iVar3 = 0x8a1;
        }
        else {
          if (texture_target != 0xde1) {
            if (texture_target == 0x806f) goto LAB_00aaac75;
            if (texture_target != 0x84f5) {
              if (texture_target == 0x8513) goto LAB_00aaad22;
              if (texture_target != 0x8c18) {
                if (texture_target != 0x8c1a) {
                  if (texture_target == 0x9009) goto LAB_00aaaccc;
                  if (texture_target != 0x9100) {
                    if (texture_target != 0xde0) goto LAB_00aaaf19;
                    goto LAB_00aaabcf;
                  }
                  (*gl->texImage2DMultisample)
                            (0x9100,gl_max_color_texture_samples_value,texture_internalformat,
                             texture_width,texture_height,'\x01');
                  GVar1 = (*gl->getError)();
                  pcVar4 = 
                  "glTexImage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target"
                  ;
                  iVar3 = 0x894;
                  goto LAB_00aaadfb;
                }
                goto LAB_00aaac75;
              }
            }
          }
LAB_00aaac1b:
          (*gl->texImage2D)(texture_target,uVar5,texture_internalformat,
                            texture_width >> (bVar2 & 0x1f),texture_height >> (bVar2 & 0x1f),0,
                            texture_format,texture_type,(void *)0x0);
          GVar1 = (*gl->getError)();
          iVar3 = 0x878;
          pcVar4 = local_38;
        }
      }
      else if (texture_target == 0xde0) {
LAB_00aaabcf:
        (*gl->texImage1D)(texture_target,uVar5,texture_internalformat,
                          texture_width >> (bVar2 & 0x1f),0,texture_format,texture_type,(void *)0x0)
        ;
        GVar1 = (*gl->getError)();
        pcVar4 = "glTexImage1D() call failed for GL_TEXTURE_1D texture target";
        iVar3 = 0x866;
      }
      else {
        if (texture_target == 0xde1) goto LAB_00aaac1b;
        if (texture_target == 0x806f) {
LAB_00aaac75:
          (*gl->texImage3D)(texture_target,uVar5,texture_internalformat,
                            texture_width >> (bVar2 & 0x1f),texture_height >> (bVar2 & 0x1f),
                            texture_depth >> (bVar2 & 0x1f),0,texture_format,texture_type,
                            (void *)0x0);
          GVar1 = (*gl->getError)();
          iVar3 = 0x887;
          pcVar4 = local_40;
        }
        else if (texture_target == 0x8513) {
LAB_00aaad22:
          (*gl->texImage2D)(0x8515,uVar5,texture_internalformat,texture_width >> (bVar2 & 0x1f),
                            texture_height >> (bVar2 & 0x1f),0,texture_format,texture_type,
                            (void *)0x0);
          GVar1 = (*gl->getError)();
          pcVar4 = "glTexImage2D() call failed for one of the cube-map texture targets";
          iVar3 = 0x8b2;
        }
        else {
          if (texture_target == 0x8c18) goto LAB_00aaac1b;
          if (texture_target == 0x8c1a) goto LAB_00aaac75;
          if (texture_target != 0x9009) {
            if (texture_target == 0x84f5) {
              return;
            }
            if (texture_target == 0x9100) {
              return;
            }
            if (texture_target == 0x9102) {
              return;
            }
LAB_00aaaf19:
            this = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this,"Unrecognized texture target",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x8c8);
            goto LAB_00aaaf42;
          }
LAB_00aaaccc:
          (*gl->texImage3D)(texture_target,uVar5,texture_internalformat,
                            texture_width >> (bVar2 & 0x1f),texture_height >> (bVar2 & 0x1f),
                            local_44,0,texture_format,texture_type,(void *)0x0);
          GVar1 = (*gl->getError)();
          iVar3 = 0x8c1;
          pcVar4 = "glTexImage3D() call failed for GL_TEXTURE_CUBE_MAP_ARRAY texture target";
        }
      }
LAB_00aaadfb:
      glu::checkError(GVar1,pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,iVar3);
      uVar5 = uVar5 + 1;
    } while( true );
  }
  if (texture_target == 0x9102) {
    (*gl->texStorage3DMultisample)
              (0x9102,gl_max_color_texture_samples_value,texture_internalformat,texture_width,
               texture_height,texture_depth,'\x01');
    GVar1 = (*gl->getError)();
    pcVar4 = 
    "glTexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY texture target";
    iVar3 = 0x912;
    goto LAB_00aaaa7a;
  }
  if (texture_target == 0xde1) {
LAB_00aaaea9:
    if (texture_target == 0x84f5) {
      n_levels_needed = 1;
    }
    (*gl->texStorage2D)(texture_target,n_levels_needed,texture_internalformat,texture_width,
                        texture_height);
    GVar1 = (*gl->getError)();
    if (texture_target == 0xde1) {
      pcVar4 = "glTexStorage2D() call failed for GL_TEXTURE_2D texture target";
    }
    else if (texture_target == 0x8c18) {
      pcVar4 = "glTexStorage2D() call failed for GL_TEXTURE_1D_ARRAY texture target";
    }
    else {
      pcVar4 = "glTexStorage2D() call failed for GL_TEXTURE_RECTANGLE texture target";
      if (texture_target == 0x8513) {
        pcVar4 = "glTexStorage2D() call failed for GL_TEXTURE_CUBE_MAP texture target";
      }
    }
    iVar3 = 0x8eb;
  }
  else {
    if (texture_target != 0x806f) {
      if (((texture_target == 0x84f5) || (texture_target == 0x8513)) || (texture_target == 0x8c18))
      goto LAB_00aaaea9;
      if (texture_target != 0x8c1a) {
        if (texture_target == 0x9009) {
          (*gl->texStorage3D)(0x9009,n_levels_needed,texture_internalformat,texture_width,
                              texture_height,n_cubemaps_needed * 6);
          GVar1 = (*gl->getError)();
          pcVar4 = "glTexStorage3D() call failed for GL_TEXTURE_CUBE_MAP_ARRAY texture target";
          iVar3 = 0x91f;
        }
        else if (texture_target == 0x9100) {
          (*gl->texStorage2DMultisample)
                    (0x9100,gl_max_color_texture_samples_value,texture_internalformat,texture_width,
                     texture_height,'\x01');
          GVar1 = (*gl->getError)();
          pcVar4 = 
          "glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target";
          iVar3 = 0x905;
        }
        else {
          if (texture_target != 0xde0) {
            this = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this,"Unrecognized texture target",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x926);
LAB_00aaaf42:
            __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (*gl->texStorage1D)(0xde0,n_levels_needed,texture_internalformat,texture_width);
          GVar1 = (*gl->getError)();
          pcVar4 = "glTexStorage1D() call failed for GL_TEXTURE_1D texture target";
          iVar3 = 0x8d6;
        }
        goto LAB_00aaaa7a;
      }
    }
    (*gl->texStorage3D)(texture_target,n_levels_needed,texture_internalformat,texture_width,
                        texture_height,texture_depth);
    GVar1 = (*gl->getError)();
    pcVar4 = "glTexStorage3D() call failed for GL_TEXTURE_3D texture target";
    if (texture_target == 0x8c1a) {
      pcVar4 = "glTexStorage3D() call failed for GL_TEXTURE_2D_ARRAY texture target";
    }
    iVar3 = 0x8f9;
  }
LAB_00aaaa7a:
  glu::checkError(GVar1,pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,iVar3);
  return;
}

Assistant:

void TextureViewUtilities::initTextureStorage(const glw::Functions& gl, bool init_mutable_to,
											  glw::GLenum texture_target, glw::GLint texture_depth,
											  glw::GLint texture_height, glw::GLint texture_width,
											  glw::GLenum texture_internalformat, glw::GLenum texture_format,
											  glw::GLenum texture_type, unsigned int n_levels_needed,
											  unsigned int n_cubemaps_needed, glw::GLint bo_id)
{
	const glw::GLenum cubemap_texture_targets[] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
													GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
													GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };
	const unsigned int n_cubemap_texture_targets = sizeof(cubemap_texture_targets) / sizeof(cubemap_texture_targets[0]);

	/* If we're going to be initializing a multisample texture object,
	 * determine how many samples can be used for GL_RGBA8 internalformat,
	 * given texture target that is of our interest */
	glw::GLint gl_max_color_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES");

	if (texture_target == GL_TEXTURE_BUFFER)
	{
		gl.texBuffer(GL_TEXTURE_BUFFER, texture_internalformat, bo_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexBuffer() call failed for GL_TEXTURE_BUFFER target");
	}
	else if (init_mutable_to)
	{
		for (unsigned int n_level = 0; n_level < n_levels_needed; ++n_level)
		{
			/* If level != 0 and we're trying to initialize a texture target which
			 * only accepts a single level, leave now
			 */
			if (n_level != 0 &&
				(texture_target == GL_TEXTURE_RECTANGLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				 texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY || texture_target == GL_TEXTURE_BUFFER))
			{
				break;
			}

			/* Initialize mutable texture storage */
			switch (texture_target)
			{
			case GL_TEXTURE_1D:
			{
				gl.texImage1D(texture_target, n_level, texture_internalformat, texture_width >> n_level, 0, /* border */
							  texture_format, texture_type, DE_NULL);										/* pixels */

				GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D() call failed for GL_TEXTURE_1D texture target");

				break;
			}

			case GL_TEXTURE_1D_ARRAY:
			case GL_TEXTURE_2D:
			case GL_TEXTURE_RECTANGLE:
			{
				gl.texImage2D(texture_target, n_level, texture_internalformat, texture_width >> n_level,
							  texture_height >> n_level, 0,			  /* border */
							  texture_format, texture_type, DE_NULL); /* pixels */

				GLU_EXPECT_NO_ERROR(gl.getError(),
									(texture_target == GL_TEXTURE_1D_ARRAY) ?
										"glTexImage2D() call failed for GL_TEXTURE_1D_ARRAY texture target" :
										(texture_target == GL_TEXTURE_2D) ?
										"glTexImage2D() call failed for GL_TEXTURE_2D texture target" :
										"glTexImage2D() call failed for GL_TEXTURE_RECTANGLE texture target");

				break;
			}

			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.texImage3D(texture_target, n_level, texture_internalformat, texture_width >> n_level,
							  texture_height >> n_level, texture_depth >> n_level, 0, /* border */
							  texture_format, texture_type, DE_NULL);				  /* pixels */

				GLU_EXPECT_NO_ERROR(gl.getError(),
									(texture_target == GL_TEXTURE_2D_ARRAY) ?
										"glTexImage3D() call failed for GL_TEXTURE_2D_ARRAY texture target" :
										"glTexImage3D() call failed for GL_TEXTURE_3D texture target");

				break;
			}

			case GL_TEXTURE_2D_MULTISAMPLE:
			{
				gl.texImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, gl_max_color_texture_samples_value,
										 texture_internalformat, texture_width >> n_level, texture_height >> n_level,
										 GL_TRUE); /* fixedsamplelocations */

				GLU_EXPECT_NO_ERROR(
					gl.getError(),
					"glTexImage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target");

				break;
			}

			case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			{
				gl.texImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, gl_max_color_texture_samples_value,
										 texture_internalformat, texture_width >> n_level, texture_height >> n_level,
										 texture_depth >> n_level, GL_TRUE); /* fixedsamplelocations */

				GLU_EXPECT_NO_ERROR(
					gl.getError(),
					"glTexImage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY texture target");

				break;
			}

			case GL_TEXTURE_CUBE_MAP:
			{
				for (unsigned int n_cubemap_texture_target = 0; n_cubemap_texture_target < n_cubemap_texture_targets;
					 ++n_cubemap_texture_target)
				{
					glw::GLenum cubemap_texture_target = cubemap_texture_targets[n_cubemap_texture_target];

					gl.texImage2D(cubemap_texture_target, n_level, texture_internalformat, texture_width >> n_level,
								  texture_height >> n_level, 0,			  /* border */
								  texture_format, texture_type, DE_NULL); /* pixels */

					GLU_EXPECT_NO_ERROR(gl.getError(),
										"glTexImage2D() call failed for one of the cube-map texture targets");

					break;
				} /* for (all cube-map texture targets) */

				break;
			}

			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.texImage3D(texture_target, n_level, texture_internalformat, texture_width >> n_level,
							  texture_height >> n_level, 6 /* layer-faces */ * n_cubemaps_needed, 0, /* border */
							  texture_format, texture_type, DE_NULL);								 /* pixels */

				GLU_EXPECT_NO_ERROR(gl.getError(),
									"glTexImage3D() call failed for GL_TEXTURE_CUBE_MAP_ARRAY texture target");

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized texture target");
			}
			} /* switch (texture_target) */
		}	 /* for (all levels) */
	}		  /* if (texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT) */
	else
	{
		/* Initialize immutable texture storage */
		switch (texture_target)
		{
		case GL_TEXTURE_1D:
		{
			gl.texStorage1D(texture_target, n_levels_needed, texture_internalformat, texture_width);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage1D() call failed for GL_TEXTURE_1D texture target");

			break;
		}

		case GL_TEXTURE_1D_ARRAY:
		case GL_TEXTURE_2D:
		case GL_TEXTURE_CUBE_MAP:
		case GL_TEXTURE_RECTANGLE:
		{
			const unsigned n_levels = (texture_target == GL_TEXTURE_RECTANGLE) ? 1 : n_levels_needed;

			gl.texStorage2D(texture_target, n_levels, texture_internalformat, texture_width, texture_height);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								(texture_target == GL_TEXTURE_1D_ARRAY) ?
									"glTexStorage2D() call failed for GL_TEXTURE_1D_ARRAY texture target" :
									(texture_target == GL_TEXTURE_2D) ?
									"glTexStorage2D() call failed for GL_TEXTURE_2D texture target" :
									(texture_target == GL_TEXTURE_CUBE_MAP) ?
									"glTexStorage2D() call failed for GL_TEXTURE_CUBE_MAP texture target" :
									"glTexStorage2D() call failed for GL_TEXTURE_RECTANGLE texture target");

			break;
		}

		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
		{
			gl.texStorage3D(texture_target, n_levels_needed, texture_internalformat, texture_width, texture_height,
							texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								(texture_target == GL_TEXTURE_2D_ARRAY) ?
									"glTexStorage3D() call failed for GL_TEXTURE_2D_ARRAY texture target" :
									"glTexStorage3D() call failed for GL_TEXTURE_3D texture target");

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE:
		{
			gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, gl_max_color_texture_samples_value,
									   texture_internalformat, texture_width, texture_height,
									   GL_TRUE); /* fixedsamplelocations */

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target");

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		{
			gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, gl_max_color_texture_samples_value,
									   texture_internalformat, texture_width, texture_height, texture_depth,
									   GL_TRUE); /* fixedsamplelocations */

			GLU_EXPECT_NO_ERROR(
				gl.getError(),
				"glTexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY texture target");

			break;
		}

		case GL_TEXTURE_CUBE_MAP_ARRAY:
		{
			const unsigned int actual_texture_depth = 6 /* layer-faces */ * n_cubemaps_needed;

			gl.texStorage3D(texture_target, n_levels_needed, texture_internalformat, texture_width, texture_height,
							actual_texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glTexStorage3D() call failed for GL_TEXTURE_CUBE_MAP_ARRAY texture target");

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized texture target");
		}
		} /* switch (texture_target) */
	}
}